

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.h
# Opt level: O0

Rect __thiscall lunasvg::Rect::intersected(Rect *this,Rect *rect)

{
  Rect RVar1;
  bool bVar2;
  float *pfVar3;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float b;
  float local_34;
  float local_30;
  float r;
  float t;
  float l;
  Rect *rect_local;
  Rect *this_local;
  undefined8 local_10;
  
  _t = rect;
  rect_local = this;
  bVar2 = isValid(rect);
  if (bVar2) {
    bVar2 = isValid(this);
    if (bVar2) {
      pfVar3 = std::max<float>(&this->x,&_t->x);
      r = *pfVar3;
      pfVar3 = std::max<float>(&this->y,&_t->y);
      local_30 = *pfVar3;
      b = this->x + this->w;
      local_3c = _t->x + _t->w;
      pfVar3 = std::min<float>(&b,&local_3c);
      local_34 = *pfVar3;
      local_44 = this->y + this->h;
      local_48 = _t->y + _t->h;
      pfVar3 = std::min<float>(&local_44,&local_48);
      local_40 = *pfVar3;
      if ((local_34 <= r) || (local_40 <= local_30)) {
        this_local = (Rect *)0x0;
        local_10._0_4_ = 0.0;
        local_10._4_4_ = 0.0;
      }
      else {
        Rect((Rect *)&this_local,r,local_30,local_34 - r,local_40 - local_30);
      }
    }
    else {
      this_local = *(Rect **)_t;
      local_10._0_4_ = _t->w;
      local_10._4_4_ = _t->h;
    }
  }
  else {
    this_local = *(Rect **)this;
    local_10._0_4_ = this->w;
    local_10._4_4_ = this->h;
  }
  RVar1.w = (float)local_10;
  RVar1.h = local_10._4_4_;
  RVar1._0_8_ = this_local;
  return RVar1;
}

Assistant:

constexpr Rect Rect::intersected(const Rect& rect) const
{
    if(!rect.isValid())
        return *this;
    if(!isValid())
        return rect;
    auto l = std::max(x, rect.x);
    auto t = std::max(y, rect.y);
    auto r = std::min(x + w, rect.x + rect.w);
    auto b = std::min(y + h, rect.y + rect.h);
    if(l >= r || t >= b)
        return Rect::Empty;
    return Rect(l, t, r - l, b - t);
}